

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

void singleOptionHelp(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  ushort uVar1;
  char cVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char *pcVar6;
  byte *pbVar7;
  void *pvVar8;
  poptOption *ppVar9;
  uint uVar10;
  float fVar11;
  double *pdVar12;
  poptOption *opt_00;
  undefined1 *__size;
  undefined1 *puVar13;
  poptOption *ppVar14;
  char *pcVar15;
  char *pcVar16;
  byte *pbVar17;
  FILE *__s;
  char *pcVar18;
  byte bVar19;
  long lVar20;
  byte *__s_00;
  double dVar21;
  mbstate_t t;
  char *pcStack_d8;
  mbstate_t mStack_d0;
  char *pcStack_c8;
  ushort **ppuStack_c0;
  char *pcStack_b8;
  byte *pbStack_b0;
  byte *pbStack_a8;
  code *pcStack_a0;
  byte *local_90;
  char *local_88;
  poptOption *local_80;
  byte *local_78;
  long *local_70;
  byte *local_68;
  char *local_60;
  FILE *local_58;
  columns_t local_50;
  byte *local_48;
  mbstate_t local_40;
  char *local_38;
  
  __s_00 = *(byte **)(translation_domain + 0x20);
  pcStack_a0 = (code *)0x106b93;
  local_80 = opt;
  local_58 = (FILE *)fp;
  local_88 = getArgDescrip((poptOption *)translation_domain,(char *)columns);
  pcStack_a0 = (code *)0x106b9d;
  ppuVar4 = __ctype_b_loc();
  local_68 = (byte *)(long)translation_domain[8];
  local_90 = (byte *)CONCAT71(local_90._1_7_,local_68 != (byte *)0x20);
  bVar19 = *(byte *)((long)*ppuVar4 + (long)local_68 * 2 + 1);
  puVar13 = (undefined1 *)((long)&columns->cur + 1);
  local_60 = *(char **)translation_domain;
  local_50 = columns;
  if (local_60 != (char *)0x0) {
    pcStack_a0 = (code *)0x106bd6;
    sVar5 = strlen(local_60);
    puVar13 = puVar13 + sVar5;
  }
  pcVar18 = local_88;
  local_78 = (byte *)CONCAT44(local_78._4_4_,*(uint *)(translation_domain + 0xc));
  __size = puVar13 + 4;
  if ((*(uint *)(translation_domain + 0xc) >> 0x15 & 1) == 0) {
    __size = puVar13;
  }
  local_70 = (long *)translation_domain;
  if (local_88 != (char *)0x0) {
    pcStack_a0 = (code *)0x106c04;
    sVar5 = strlen(local_88);
    __size = __size + sVar5;
  }
  ppVar14 = local_80;
  pcStack_a0 = (code *)0x106c14;
  pcVar6 = (char *)malloc((size_t)__size);
  pcVar16 = local_60;
  if (pcVar6 == (char *)0x0) {
    return;
  }
  *pcVar6 = '\0';
  pcVar6[(long)local_50] = '\0';
  bVar19 = (byte)local_90 & (bVar19 & 0x40) >> 6;
  local_90 = (byte *)CONCAT71(local_90._1_7_,bVar19);
  if (bVar19 == 0) {
    if (local_60 != (char *)0x0) {
      pcVar18 = "-";
      if (-1 < (int)(uint)local_78) {
        pcVar18 = "--";
      }
      pcVar16 = "";
      if ((_poptArgMask & (uint)local_78) == 0x1b) {
        pcVar18 = "";
      }
      pcVar15 = local_60;
      if (((((uint)local_78 >> 0x15 & 1) != 0) && (pcVar16 = "[no]", *local_60 == 'n')) &&
         (local_60[1] == 'o')) {
        pcVar15 = local_60 + 2;
        if (local_60[2] == '-') {
          pcVar15 = local_60 + 3;
        }
      }
      builtin_strncpy(pcVar6,"    ",5);
      pcStack_a0 = (code *)0x106d0c;
      pcVar18 = stpcpy(pcVar6 + 4,pcVar18);
      pcStack_a0 = (code *)0x106d17;
      pcVar18 = stpcpy(pcVar18,pcVar16);
      pcStack_a0 = (code *)0x106d22;
      strcpy(pcVar18,pcVar15);
      pcVar18 = local_88;
      goto LAB_00106d38;
    }
    goto LAB_00107271;
  }
  if (local_60 == (char *)0x0) {
    *pcVar6 = '-';
    pcVar6[1] = (char)local_68;
    pcVar6[2] = '\0';
  }
  else {
    pcVar15 = "-";
    if (-1 < (int)(uint)local_78) {
      pcVar15 = "--";
    }
    *pcVar6 = '-';
    pcVar6[1] = (char)local_68;
    pcVar6[2] = ',';
    pcVar6[3] = ' ';
    pcVar6[4] = '\0';
    pcStack_a0 = (code *)0x106c7e;
    pcVar15 = stpcpy(pcVar6 + 4,pcVar15);
    pcStack_a0 = (code *)0x106c89;
    strcpy(pcVar15,pcVar16);
  }
LAB_00106d38:
  local_60 = (char *)((long)&local_50->cur + 5);
  ppVar14 = (poptOption *)((long)ppVar14 - (long)local_60);
  local_80 = ppVar14;
  if (pcVar18 == (char *)0x0) {
    iVar3 = 0;
    pbVar7 = (byte *)0x0;
    goto LAB_001070bd;
  }
  pcStack_a0 = (code *)0x106d5f;
  sVar5 = strlen(pcVar6);
  pcVar18 = pcVar6 + sVar5;
  uVar10 = *(uint *)((long)local_70 + 0xc);
  if ((uVar10 >> 0x1c & 1) != 0) {
    *pcVar18 = '[';
    pcVar18 = pcVar18 + 1;
  }
  if ((uVar10 >> 0x17 & 1) == 0) {
LAB_00106e02:
    local_90 = (byte *)0x0;
    pcVar16 = local_88;
    goto LAB_00106f9f;
  }
  pcStack_a0 = (code *)0x106d91;
  pbVar7 = (byte *)malloc((long)ppVar14 * 4 + 1);
  if (pbVar7 == (byte *)0x0) goto LAB_00106e02;
  *pbVar7 = 0x28;
  pbVar7[1] = 100;
  pbVar7[2] = 0x65;
  pbVar7[3] = 0x66;
  pbVar7[4] = 0x61;
  pbVar7[5] = 0x75;
  pbVar7[6] = 0x6c;
  pbVar7[7] = 0x74;
  pbVar7[8] = 0x3a;
  pbVar17 = pbVar7 + 10;
  pbVar7[9] = 0x20;
  pdVar12 = (double *)local_70[2];
  local_90 = pbVar7;
  if (pdVar12 == (double *)0x0) goto LAB_00106f19;
  local_78 = (byte *)0x0;
  pcVar16 = local_88;
  switch(uVar10 & _poptArgMask) {
  case 1:
    pcVar16 = (char *)*pdVar12;
    if (pcVar16 == (char *)0x0) {
      pbVar7[0xe] = 0;
      pbVar17[0] = 0x6e;
      pbVar17[1] = 0x75;
      pbVar17[2] = 0x6c;
      pbVar17[3] = 0x6c;
      pbVar17 = pbVar7 + 0xe;
    }
    else {
      local_78 = (byte *)((long)ppVar14 * 4);
      local_48 = local_78 + -0xe;
      local_68 = pbVar7 + 0xb;
      pbVar7[10] = 0x22;
      pcStack_a0 = (code *)0x106ebe;
      strncpy((char *)local_68,pcVar16,(size_t)local_48);
      (pbVar7 + -3)[(long)local_78] = 0;
      pcStack_a0 = (code *)0x106ed2;
      pbVar17 = (byte *)strlen((char *)local_68);
      pbVar7 = pbVar17 + (long)pbVar7;
      if ((pbVar17 == local_48) && (pcVar16[(long)local_48] != '\0')) {
        pbVar7[8] = 0x2e;
        pbVar7[9] = 0x2e;
        pbVar7[10] = 0x2e;
      }
      pbVar7[0xb] = 0x22;
      pbVar17 = pbVar7 + 0xc;
    }
    goto LAB_00106f19;
  case 2:
  case 7:
    fVar11 = *(float *)pdVar12;
    pcVar16 = "%d";
    goto LAB_00106e4a;
  case 3:
    pdVar12 = (double *)*pdVar12;
    pcVar16 = "%ld";
    break;
  case 4:
  case 5:
  case 6:
  case 0xb:
    goto switchD_00106df5_caseD_4;
  case 8:
    dVar21 = (double)*(float *)pdVar12;
    goto LAB_00106e5d;
  case 9:
    dVar21 = *pdVar12;
LAB_00106e5d:
    pcStack_a0 = (code *)0x106e6e;
    iVar3 = sprintf((char *)pbVar17,"%g",dVar21);
    goto LAB_00106f11;
  case 10:
    pdVar12 = (double *)*pdVar12;
    pcVar16 = "%lld";
    break;
  case 0xc:
switchD_00106df5_caseD_c:
    pcVar16 = "%p";
    break;
  case 0xd:
    fVar11 = (float)(int)*(short *)pdVar12;
    pcVar16 = "%hd";
LAB_00106e4a:
    pcStack_a0 = (code *)0x106e54;
    iVar3 = sprintf((char *)pbVar17,pcVar16,(ulong)(uint)fVar11);
    goto LAB_00106f11;
  default:
    if ((uVar10 & _poptArgMask) == 0x1b) goto switchD_00106df5_caseD_c;
    goto switchD_00106df5_caseD_4;
  }
  pcStack_a0 = (code *)0x106f11;
  iVar3 = sprintf((char *)pbVar17,pcVar16,pdVar12);
LAB_00106f11:
  pbVar17 = pbVar17 + iVar3;
LAB_00106f19:
  pbVar17[0] = 0x29;
  pbVar17[1] = 0;
  if (__s_00 == (byte *)0x0) {
    lVar20 = 2;
  }
  else {
    pcStack_a0 = (code *)0x106f2b;
    sVar5 = strlen((char *)__s_00);
    lVar20 = sVar5 + 2;
  }
  pcStack_a0 = (code *)0x106f44;
  sVar5 = strlen((char *)local_90);
  pcStack_a0 = (code *)0x106f4f;
  pbVar7 = (byte *)malloc(lVar20 + sVar5);
  pcVar16 = local_88;
  if (pbVar7 != (byte *)0x0) {
    pbVar17 = pbVar7;
    if (__s_00 != (byte *)0x0) {
      pcStack_a0 = (code *)0x106f73;
      pbVar17 = (byte *)stpcpy((char *)pbVar7,(char *)__s_00);
    }
    *pbVar17 = 0x20;
    pcStack_a0 = (code *)0x106f8b;
    local_78 = pbVar7;
    strcpy((char *)(pbVar17 + 1),(char *)local_90);
switchD_00106df5_caseD_4:
    pcStack_a0 = (code *)0x106f95;
    free(local_90);
    local_90 = local_78;
  }
LAB_00106f9f:
  if (local_70[5] == 0) {
    uVar10 = *(uint *)((long)local_70 + 0xc);
    iVar3 = 0;
    if (((_poptArgMask & uVar10) < 0xe) && ((0x270eU >> (_poptArgMask & uVar10 & 0x1f) & 1) != 0)) {
      cVar2 = '=';
      if (*local_70 == 0) {
        cVar2 = ' ';
      }
      *pcVar18 = cVar2;
      pcStack_a0 = (code *)0x10709b;
      pcVar18 = stpcpy(pcVar18 + 1,pcVar16);
      iVar3 = 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x106fc4;
    pvVar8 = memchr(" =(",(int)*pcVar16,4);
    pcVar15 = pcVar18;
    if (pvVar8 == (void *)0x0) {
      uVar10 = _poptArgMask & *(uint *)((long)local_70 + 0xc);
      cVar2 = ' ';
      if (((uVar10 != 0xc) && (uVar10 != 0x1b)) && (cVar2 = '=', *local_70 == 0)) {
        cVar2 = ' ';
      }
      *pcVar18 = cVar2;
      pcVar15 = pcVar18 + 1;
    }
    pcStack_a0 = (code *)0x10700e;
    pcVar18 = stpcpy(pcVar15,pcVar16);
    pcStack_a0 = (code *)0x107022;
    local_38 = pcVar16;
    sVar5 = strlen(pcVar16);
    local_40.__count = 0;
    local_40.__value = (_union_27)0x0;
    pcStack_a0 = (code *)0x10703b;
    sVar5 = mbsrtowcs((wchar_t *)0x0,&local_38,sVar5,&local_40);
    iVar3 = (int)pcVar18 - ((int)pcVar15 + (int)sVar5);
    uVar10 = *(uint *)((long)local_70 + 0xc);
  }
  if ((uVar10 >> 0x1c & 1) != 0) {
    *pcVar18 = ']';
    pcVar18 = pcVar18 + 1;
  }
  *pcVar18 = '\0';
  pbVar7 = local_90;
LAB_001070bd:
  ppVar14 = local_80;
  if (__s_00 == (byte *)0x0) {
    pcStack_a0 = (code *)0x107240;
    POPT_fprintf((FILE *)local_58,"  %s\n",pcVar6);
  }
  else {
    pcVar18 = "  %-*s   ";
    pcStack_a0 = (code *)0x1070e0;
    POPT_fprintf((FILE *)local_58,"  %-*s   ",(ulong)(uint)(iVar3 + (int)local_50),pcVar6);
    pcStack_a0 = (code *)0x1070e8;
    free(pcVar6);
    if (pbVar7 != (byte *)0x0) {
      __s_00 = pbVar7;
    }
    pcStack_a0 = (code *)0x1070f7;
    ppVar9 = (poptOption *)strlen((char *)__s_00);
    pbVar17 = __s_00;
    if (ppVar14 < ppVar9) {
      do {
        local_90 = pbVar7;
        pbVar17 = __s_00 + (long)ppVar14 + -1;
        while ((__s_00 < pbVar17 &&
               ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar17 * 2 + 1) & 0x20) == 0))) {
          pcStack_a0 = (code *)0x107135;
          pbVar17 = (byte *)POPT_prev_char((char *)pbVar17);
        }
        pbVar7 = local_90;
        if (pbVar17 == __s_00) goto LAB_00107247;
        while ((__s_00 + 1 < pbVar17 &&
               ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar17 * 2 + 1) & 0x20) != 0))) {
          pcStack_a0 = (code *)0x10715f;
          pbVar17 = (byte *)POPT_prev_char((char *)pbVar17);
        }
        pcStack_a0 = (code *)0x107169;
        pbVar17 = (byte *)POPT_next_char((char *)pbVar17);
        pcStack_a0 = (code *)0x107174;
        sVar5 = strlen((char *)__s_00);
        __s = (FILE *)(sVar5 + 1);
        pcStack_a0 = (code *)0x10717d;
        pcVar16 = (char *)malloc((size_t)__s);
        if (pcVar16 == (char *)0x0) {
          pcStack_a0 = singleOptionUsage;
          singleOptionHelp_cold_1();
          pcStack_b8 = " ";
          pcStack_c8 = "%s\n%*s";
          ppuStack_c0 = ppuVar4;
          pbStack_b0 = __s_00 + 1;
          pbStack_a8 = __s_00;
          pcStack_a0 = (code *)pbVar17;
          pcVar6 = getArgDescrip(opt_00,pcVar18);
          ppuVar4 = __ctype_b_loc();
          pcVar16 = opt_00->longName;
          bVar19 = (*(byte *)((long)*ppuVar4 + (long)opt_00->shortName * 2 + 1) & 0x40) >> 6 &
                   (long)opt_00->shortName != 0x20;
          if (bVar19 == 0) {
            lVar20 = 3;
            if (pcVar16 == (char *)0x0) {
              return;
            }
          }
          else {
            lVar20 = 5;
            if (pcVar16 == (char *)0x0) goto LAB_0010734d;
          }
          uVar10 = opt_00->argInfo;
          sVar5 = strlen(pcVar16);
          lVar20 = (ulong)(-1 < (int)uVar10) + sVar5 + lVar20 + (ulong)bVar19 + 1;
LAB_0010734d:
          if (pcVar6 != (char *)0x0) {
            pvVar8 = memchr(" =(",(int)*pcVar6,4);
            pcStack_d8 = pcVar6;
            sVar5 = strlen(pcVar6);
            mStack_d0.__count = 0;
            mStack_d0.__value = (_union_27)0x0;
            sVar5 = mbsrtowcs((wchar_t *)0x0,&pcStack_d8,sVar5,&mStack_d0);
            lVar20 = lVar20 + sVar5 + (ulong)(pvVar8 == (void *)0x0);
          }
          if (*(ulong *)((long)pcVar18 + 8) < (ulong)(*(long *)pcVar18 + lVar20)) {
            fwrite("\n       ",8,1,__s);
            *(long *)pcVar18 = 7;
          }
          fwrite(" [",2,1,__s);
          if (bVar19 != 0) {
            fprintf(__s,"-%c",(ulong)(uint)(int)opt_00->shortName);
          }
          if (opt_00->longName != (char *)0x0) {
            pcVar18 = "";
            if (bVar19 != 0) {
              pcVar18 = "|";
            }
            pcVar16 = "-";
            if (-1 < (int)opt_00->argInfo) {
              pcVar16 = "--";
            }
            fprintf(__s,"%s%s%s",pcVar18,pcVar16);
          }
          if (pcVar6 != (char *)0x0) {
            pvVar8 = memchr(" =(",(int)*pcVar6,4);
            if (pvVar8 == (void *)0x0) {
              iVar3 = 0x3d;
              if (opt_00->longName == (char *)0x0) {
                iVar3 = 0x20;
              }
              fputc(iVar3,__s);
            }
            fputs(pcVar6,__s);
          }
          fputc(0x5d,__s);
          return;
        }
        pcStack_a0 = (code *)0x107194;
        strcpy(pcVar16,(char *)__s_00);
        pcVar16[(long)pbVar17 - (long)__s_00] = '\0';
        pcVar18 = "%s\n%*s";
        pcStack_a0 = (code *)0x1071b9;
        POPT_fprintf((FILE *)local_58,"%s\n%*s",pcVar16,local_60," ");
        pcStack_a0 = (code *)0x1071c1;
        free(pcVar16);
        ppVar14 = local_80;
        if (*pbVar17 != 0) {
          uVar1 = (*ppuVar4)[*pbVar17];
          while ((uVar1 & 0x2000) != 0) {
            pcStack_a0 = (code *)0x1071e8;
            pbVar17 = (byte *)POPT_next_char((char *)pbVar17);
            if (*pbVar17 == 0) break;
            uVar1 = (*ppuVar4)[*pbVar17];
          }
        }
        pcStack_a0 = (code *)0x107213;
        ppVar9 = (poptOption *)strlen((char *)pbVar17);
        pbVar7 = local_90;
        __s_00 = pbVar17;
      } while (ppVar14 < ppVar9);
    }
    __s_00 = pbVar17;
    if (ppVar9 == (poptOption *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
LAB_00107247:
      pcVar6 = (char *)0x0;
      pcStack_a0 = (code *)0x10725f;
      fprintf(local_58,"%s\n",__s_00);
    }
  }
  if (pbVar7 != (byte *)0x0) {
    pcStack_a0 = (code *)0x10726c;
    free(pbVar7);
  }
  if (pcVar6 != (char *)0x0) {
LAB_00107271:
    pcStack_a0 = (code *)0x107279;
    free(pcVar6);
  }
  return;
}

Assistant:

static void singleOptionHelp(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain)
{
    size_t maxLeftCol = columns->cur;
    size_t indentLength = maxLeftCol + 5;
    size_t lineLength = columns->max - indentLength;
    const char * help = D_(translation_domain, opt->descrip);
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');
    size_t helpLength;
    char * defs = NULL;
    char * left;
    size_t nb = maxLeftCol + 1;
    int displaypad = 0;

    /* Make sure there's more than enough room in target buffer. */
    if (opt->longName)	nb += strlen(opt->longName);
    if (F_ISSET(opt, TOGGLE)) nb += sizeof("[no]") - 1;
    if (argDescrip)	nb += strlen(argDescrip);

    left = malloc(nb);
    if (left == NULL) return;	/* XXX can't happen */
    left[0] = '\0';
    left[maxLeftCol] = '\0';

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	goto out;
    if (prtshort && prtlong) {
	const char *dash = F_ISSET(opt, ONEDASH) ? "-" : "--";
	left[0] = '-';
	left[1] = opt->shortName;
	(void) stpcpy(stpcpy(stpcpy(left+2, ", "), dash), opt->longName);
    } else if (prtshort) {
	left[0] = '-';
	left[1] = opt->shortName;
	left[2] = '\0';
    } else if (prtlong) {
	/* XXX --long always padded for alignment with/without "-X, ". */
	const char *dash = poptArgType(opt) == POPT_ARG_MAINCALL ? ""
			 : (F_ISSET(opt, ONEDASH) ? "-" : "--");
	const char *longName = opt->longName;
	const char *toggle;
	if (F_ISSET(opt, TOGGLE)) {
	    toggle = "[no]";
	    if (longName[0] == 'n' && longName[1] == 'o') {
		longName += sizeof("no") - 1;
		if (longName[0] == '-')
		    longName++;
	    }
	} else
	    toggle = "";
	(void) stpcpy(stpcpy(stpcpy(stpcpy(left, "    "), dash), toggle), longName);
    }
#undef	prtlong

    if (argDescrip) {
	char * le = left + strlen(left);

	if (F_ISSET(opt, OPTIONAL))
	    *le++ = '[';

	/* Choose type of output */
	if (F_ISSET(opt, SHOW_DEFAULT)) {
	    defs = singleOptionDefaultValue(lineLength, opt, translation_domain);
	    if (defs) {
		char * t = malloc((help ? strlen(help) : 0) +
				strlen(defs) + sizeof(" "));
		if (t) {
		    char * te = t;
		    if (help)
			te = stpcpy(te, help);
		    *te++ = ' ';
		    strcpy(te, defs);
		    defs = _free(defs);
		    defs = t;
		}
	    }
	}

	if (opt->argDescrip == NULL) {
	    switch (poptArgType(opt)) {
	    case POPT_ARG_NONE:
		break;
	    case POPT_ARG_VAL:
#ifdef	NOTNOW	/* XXX pug ugly nerdy output */
	    {	long aLong = opt->val;
		int ops = F_ISSET(opt, LOGICALOPS);
		int negate = F_ISSET(opt, NOT);

		/* Don't bother displaying typical values */
		if (!ops && (aLong == 0L || aLong == 1L || aLong == -1L))
		    break;
		*le++ = '[';
		switch (ops) {
		case POPT_ARGFLAG_OR:
		    *le++ = '|';
		    break;
		case POPT_ARGFLAG_AND:
		    *le++ = '&';
		    break;
		case POPT_ARGFLAG_XOR:
		    *le++ = '^';
		    break;
		default:
		    break;
		}
		*le++ = (opt->longName != NULL ? '=' : ' ');
		if (negate) *le++ = '~';
		le += sprintf(le, (ops ? "0x%lx" : "%ld"), aLong);
		*le++ = ']';
	    }
#endif
		break;
	    case POPT_ARG_INT:
	    case POPT_ARG_SHORT:
	    case POPT_ARG_LONG:
	    case POPT_ARG_LONGLONG:
	    case POPT_ARG_FLOAT:
	    case POPT_ARG_DOUBLE:
	    case POPT_ARG_STRING:
		*le++ = (opt->longName != NULL ? '=' : ' ');
		le = stpcpy(le, argDescrip);
		break;
	    default:
		break;
	    }
	} else {
	    char *leo;

	    /* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	    if (!strchr(" =(", argDescrip[0]))
		*le++ = ((poptArgType(opt) == POPT_ARG_MAINCALL) ? ' ' :
			 (poptArgType(opt) == POPT_ARG_ARGV) ? ' ' :
			 opt->longName == NULL ? ' ' : '=');
	    le = stpcpy(leo = le, argDescrip);

	    /* Adjust for (possible) wide characters. */
	    displaypad = (int)((le - leo) - stringDisplayWidth(argDescrip));
	}
	if (F_ISSET(opt, OPTIONAL))
	    *le++ = ']';
	*le = '\0';
    }

    if (help)
	POPT_fprintf(fp,"  %-*s   ", (int)(maxLeftCol+displaypad), left);
    else {
	POPT_fprintf(fp,"  %s\n", left);
	goto out;
    }

    left = _free(left);
    if (defs)
	help = defs;

    helpLength = strlen(help);
    while (helpLength > lineLength) {
	const char * ch;

	ch = help + lineLength - 1;
	while (ch > help && !_isspaceptr(ch))
	    ch = POPT_prev_char(ch);
	if (ch == help) break;		/* give up */
	while (ch > (help + 1) && _isspaceptr(ch))
	    ch = POPT_prev_char (ch);
	ch = POPT_next_char(ch);

	/*
	 *  XXX strdup is necessary to add NUL terminator so that an unknown
	 *  no. of (possible) multi-byte characters can be displayed.
	 */
	{   char * fmthelp = xstrdup(help);
	    if (fmthelp) {
		fmthelp[ch - help] = '\0';
		POPT_fprintf(fp, "%s\n%*s", fmthelp, (int) indentLength, " ");
		free(fmthelp);
	    }
	}

	help = ch;
	while (_isspaceptr(help) && *help)
	    help = POPT_next_char(help);
	helpLength = strlen(help);
    }

    if (helpLength) fprintf(fp, "%s\n", help);
    help = NULL;

out:
    defs = _free(defs);
    left = _free(left);
}